

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O1

int next_segment(vorb *f)

{
  byte bVar1;
  int iVar2;
  
  if (f->last_seg != 0) {
    return 0;
  }
  if (f->next_seg == -1) {
    f->last_seg_which = f->segment_count + -1;
    iVar2 = start_page(f);
    if (iVar2 == 0) {
      f->last_seg = 1;
      return 0;
    }
    if ((f->page_flag & 1) == 0) {
      f->error = VORBIS_continued_packet_flag_invalid;
      return 0;
    }
  }
  iVar2 = f->next_seg;
  f->next_seg = iVar2 + 1;
  bVar1 = f->segments[iVar2];
  if (bVar1 != 0xff) {
    f->last_seg = 1;
    f->last_seg_which = iVar2;
  }
  if (f->segment_count <= iVar2 + 1) {
    f->next_seg = -1;
  }
  f->bytes_in_seg = bVar1;
  return (uint)bVar1;
}

Assistant:

static int next_segment(vorb *f)
{
   int len;
   if (f->last_seg) return 0;
   if (f->next_seg == -1) {
      f->last_seg_which = f->segment_count-1; // in case start_page fails
      if (!start_page(f)) { f->last_seg = 1; return 0; }
      if (!(f->page_flag & PAGEFLAG_continued_packet)) return error(f, VORBIS_continued_packet_flag_invalid);
   }
   len = f->segments[f->next_seg++];
   if (len < 255) {
      f->last_seg = TRUE;
      f->last_seg_which = f->next_seg-1;
   }
   if (f->next_seg >= f->segment_count)
      f->next_seg = -1;
   assert(f->bytes_in_seg == 0);
   f->bytes_in_seg = len;
   return len;
}